

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall
t_javame_generator::generate_primitive_service_interface
          (t_javame_generator *this,t_service *tservice)

{
  string *psVar1;
  t_function *tfunction;
  ostream *poVar2;
  int __oflag;
  t_javame_generator *ptVar3;
  pointer pptVar4;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_iface;
  string f_interface_name;
  ofstream_with_content_based_conditional_update f_iface;
  undefined1 local_2b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_250 [32];
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_1d0;
  
  t_generator::indent_abi_cxx11_((string *)&local_1d0,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"public interface Iface extends ");
  psVar1 = &(this->super_t_oop_generator).super_t_generator.service_name_;
  poVar2 = std::operator<<(poVar2,(string *)psVar1);
  poVar2 = std::operator<<(poVar2,"Iface { }");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::operator+(&local_290,&this->package_dir_,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                 &local_290,psVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_250 + 0x40),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                 "Iface.java");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_290);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_1d0);
  std::__cxx11::string::string
            ((string *)&local_290,local_210._M_dataplus._M_p,(allocator *)&local_270);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&local_1d0,(char *)&local_290,__oflag);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_290,"",(allocator *)&local_270);
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_
              ((string *)local_250,this,&tservice->extends_->super_t_type,false,false,false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                   " extends ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
    std::operator+(&local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                   "Iface");
    std::__cxx11::string::operator=((string *)&local_290,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)local_2b0);
    std::__cxx11::string::~string((string *)local_250);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_270);
  poVar2 = std::operator<<((ostream *)&local_1d0,(string *)&local_270);
  java_package_abi_cxx11_((string *)local_2b0,this);
  ptVar3 = (t_javame_generator *)local_2b0;
  poVar2 = std::operator<<(poVar2,(string *)ptVar3);
  java_type_imports_abi_cxx11_((string *)local_250,ptVar3);
  ptVar3 = (t_javame_generator *)local_250;
  poVar2 = std::operator<<(poVar2,(string *)ptVar3);
  java_thrift_imports_abi_cxx11_((string *)(local_250 + 0x20),ptVar3);
  std::operator<<(poVar2,(string *)(local_250 + 0x20));
  std::__cxx11::string::~string((string *)(local_250 + 0x20));
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::string::~string((string *)local_2b0);
  std::__cxx11::string::~string((string *)&local_270);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])
            (this,&local_1d0,tservice);
  poVar2 = std::operator<<((ostream *)&local_1d0,"public interface ");
  poVar2 = std::operator<<(poVar2,(string *)psVar1);
  poVar2 = std::operator<<(poVar2,"Iface");
  poVar2 = std::operator<<(poVar2,(string *)&local_290);
  poVar2 = std::operator<<(poVar2," {");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)local_2b0,&tservice->functions_)
  ;
  psVar1 = (string *)(local_250 + 0x60);
  for (pptVar4 = (pointer)local_2b0._0_8_; pptVar4 != (pointer)local_2b0._8_8_;
      pptVar4 = pptVar4 + 1) {
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
              (this,&local_1d0,*pptVar4);
    poVar2 = std::operator<<((ostream *)&local_1d0,"  public ");
    tfunction = *pptVar4;
    std::__cxx11::string::string((string *)psVar1,"",(allocator *)local_250);
    function_signature(&local_270,this,tfunction,psVar1);
    poVar2 = std::operator<<(poVar2,(string *)&local_270);
    poVar2 = std::operator<<(poVar2,";");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)psVar1);
  }
  poVar2 = std::operator<<((ostream *)&local_1d0,"}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            ((_Vector_base<t_function_*,_std::allocator<t_function_*>_> *)local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_1d0);
  std::__cxx11::string::~string((string *)(local_250 + 0x40));
  return;
}

Assistant:

void t_javame_generator::generate_primitive_service_interface(t_service* tservice) {
  f_service_ << indent() << "public interface Iface extends " << service_name_ << "Iface { }"
             << endl << endl;

  string f_interface_name = package_dir_ + "/" + service_name_ + "Iface.java";
  ofstream_with_content_based_conditional_update f_iface;
  f_iface.open(f_interface_name.c_str());

  string extends_iface = "";
  if (tservice->get_extends() != nullptr) {
    extends_iface = " extends " + type_name(tservice->get_extends()) + "Iface";
  }

  f_iface << autogen_comment() << java_package() << java_type_imports() << java_thrift_imports();
  generate_java_doc(f_iface, tservice);
  f_iface << "public interface " << service_name_ << "Iface" << extends_iface << " {" << endl
          << endl;
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_java_doc(f_iface, *f_iter);
    f_iface << "  public " << function_signature(*f_iter) << ";" << endl << endl;
  }
  f_iface << "}" << endl << endl;
}